

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

NULLCRef * nullcAllocateObjectTyped(NULLCRef *__return_storage_ptr__,uint typeID)

{
  uint size;
  char *pcVar1;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    size = nullcGetTypeSize(typeID);
    pcVar1 = (char *)NULLC::AllocObject(size,typeID);
    __return_storage_ptr__->ptr = pcVar1;
    __return_storage_ptr__->typeID = typeID;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef nullcAllocateObjectTyped(unsigned typeID)
{
	using namespace NULLC;
	NULLCRef r = { 0, 0 };
	NULLC_CHECK_INITIALIZED(r);

	r.ptr = (char*)NULLC::AllocObject(nullcGetTypeSize(typeID), typeID);
	r.typeID = typeID;

	return r;
}